

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

Metric * __thiscall xLearn::Solver::create_metric(Solver *this)

{
  char *pcVar1;
  Metric *metric;
  string *entry_name;
  ObjectCreatorRegistry_xLearn_metric_registry *in_stack_ffffffffffffffb8;
  undefined1 local_31 [33];
  Metric *local_10;
  
  GetRegistry_xLearn_metric_registry();
  pcVar1 = (char *)std::__cxx11::string::c_str();
  entry_name = (string *)local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_31 + 1),pcVar1,(allocator *)entry_name);
  local_10 = ObjectCreatorRegistry_xLearn_metric_registry::CreateObject
                       (in_stack_ffffffffffffffb8,entry_name);
  std::__cxx11::string::~string((string *)(local_31 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  return local_10;
}

Assistant:

Metric* Solver::create_metric() {
  Metric* metric;
  metric = CREATE_METRIC(hyper_param_.metric.c_str());
  // Note that here we do not cheack metric == nullptr
  // this is because we can set metric to "none", which 
  // means that we don't print any metric info.
  return metric;
}